

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::subscribe
          (moldudp64_session<helix::parity::pmd_handler> *this,string *symbol,size_t max_orders)

{
  string *in_RSI;
  size_t in_stack_00000110;
  string *in_stack_00000118;
  pmd_handler *in_stack_00000120;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  parity::pmd_handler::subscribe(in_stack_00000120,in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void moldudp64_session<Handler>::subscribe(const std::string& symbol, size_t max_orders)
{
    _handler.subscribe(symbol, max_orders);
}